

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_515ef::BinaryExpr::BinaryExpr(BinaryExpr *this,ExprPtr *l,ExprPtr *r)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__BinaryExpr_00157fd8;
  (this->left).super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (l->super_shared_ptr<pegmatite::Expr>).
       super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (l->super_shared_ptr<pegmatite::Expr>).
           super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->left).super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->right).super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (r->super_shared_ptr<pegmatite::Expr>).
       super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (r->super_shared_ptr<pegmatite::Expr>).
           super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->right).super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

BinaryExpr(const ExprPtr &l, const ExprPtr &r) :
		left(l), right(r) { }